

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::~VaryingLocationsTest(VaryingLocationsTest *this)

{
  pointer puVar1;
  
  (this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__VaryingLocationsTest_0210aa08;
  puVar1 = (this->m_last_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_last_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->m_first_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_first_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

~VaryingLocationsTest()
	{
	}